

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  ostream *poVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  string tname;
  string local_58;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"# Dependency information for all targets:\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n",0x1c);
  ppcVar2 = (lGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar3 = (lGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = lGenerators;
  if (ppcVar3 != ppcVar2) {
    uVar4 = 0;
    do {
      this_00 = (cmLocalUnixMakefileGenerator3 *)ppcVar2[uVar4];
      p_Var5 = (((this_00->super_cmLocalGenerator).Makefile)->Targets)._M_h._M_before_begin._M_nxt;
      if (p_Var5 != (_Hash_node_base *)0x0) {
        do {
          if (*(uint *)&p_Var5[0x61]._M_nxt < 6) {
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_58,this_00,(cmTarget *)(p_Var5 + 5));
            std::__cxx11::string::append((char *)&local_58);
            cmsys::SystemTools::ConvertToUnixSlashes(&local_58);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  \"",3);
            poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)cmakefileStream,local_58._M_dataplus._M_p,
                                local_58._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          p_Var5 = p_Var5->_M_nxt;
        } while (p_Var5 != (_Hash_node_base *)0x0);
        ppcVar2 = (local_38->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar3 = (local_38->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < (ulong)((long)ppcVar3 - (long)ppcVar2 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  )\n",4);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::WriteMainCMakefileLanguageRules(cmGeneratedFileStream& cmakefileStream,
                                  std::vector<cmLocalGenerator *> &lGenerators
                                  )
{
  cmLocalUnixMakefileGenerator3 *lg;

  // now list all the target info files
  cmakefileStream
    << "# Dependency information for all targets:\n";
  cmakefileStream
    << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (unsigned int i = 0; i < lGenerators.size(); ++i)
    {
    lg = static_cast<cmLocalUnixMakefileGenerator3 *>(lGenerators[i]);
    // for all of out targets
    for (cmTargets::iterator l = lg->GetMakefile()->GetTargets().begin();
         l != lg->GetMakefile()->GetTargets().end(); l++)
      {
      if((l->second.GetType() == cmTarget::EXECUTABLE) ||
         (l->second.GetType() == cmTarget::STATIC_LIBRARY) ||
         (l->second.GetType() == cmTarget::SHARED_LIBRARY) ||
         (l->second.GetType() == cmTarget::MODULE_LIBRARY) ||
         (l->second.GetType() == cmTarget::OBJECT_LIBRARY) ||
         (l->second.GetType() == cmTarget::UTILITY))
        {
        std::string tname = lg->GetRelativeTargetDirectory(l->second);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
        }
      }
    }
  cmakefileStream << "  )\n";
}